

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  ZSTD_Sequence *pZVar1;
  BYTE *pBVar2;
  BYTE **ppBVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_CDict *pZVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  undefined8 uVar9;
  BYTE *pBVar10;
  seqDef *psVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  uint *puVar15;
  ulong uVar16;
  ZSTD_CCtx *pZVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  ZSTD_CCtx *pZVar23;
  size_t sVar24;
  uint uVar25;
  int iVar26;
  uint local_80 [4];
  ZSTD_sequencePosition *local_70;
  ulong local_68;
  ulong local_60;
  ZSTD_CCtx *local_58;
  BYTE *local_50;
  BYTE *local_48;
  BYTE *local_40;
  ZSTD_CCtx *local_38;
  
  uVar4 = seqPos->idx;
  uVar14 = (ulong)uVar4;
  pZVar7 = cctx->cdict;
  if (pZVar7 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict != (void *)0x0) {
      pZVar7 = (ZSTD_CDict *)&cctx->prefixDict;
      goto LAB_01d5f821;
    }
    local_68 = 0;
  }
  else {
LAB_01d5f821:
    local_68 = (ulong)(uint)pZVar7->dictContentSize;
  }
  pZVar8 = (cctx->blockState).prevCBlock;
  local_80[2] = pZVar8->rep[2];
  uVar9 = *(undefined8 *)pZVar8->rep;
  local_80[0] = (uint)uVar9;
  local_80[1] = (uint)((ulong)uVar9 >> 0x20);
  local_70 = seqPos;
  local_50 = (BYTE *)(blockSize + (long)src);
  uVar22 = uVar4;
  if (uVar14 < inSeqsSize) {
    local_40 = (BYTE *)(blockSize + (long)src) + -0x20;
    local_58 = cctx;
    pZVar23 = cctx;
    do {
      uVar13 = local_80[1];
      uVar22 = (uint)uVar14;
      pZVar1 = inSeqs + uVar14;
      uVar5 = inSeqs[uVar14].matchLength;
      if (((ulong)uVar5 == 0) && (pZVar1->offset == 0)) break;
      uVar6 = pZVar1->litLength;
      uVar14 = (ulong)uVar6;
      if (externalRepSearch == ZSTD_ps_disable) {
        uVar25 = pZVar1->offset + 3;
      }
      else {
        uVar18 = pZVar1->offset;
        if ((uVar14 == 0) || (uVar25 = 1, local_80[0] != uVar18)) {
          if (local_80[1] == uVar18) {
            iVar26 = 2;
          }
          else {
            if (local_80[2] != uVar18) {
              uVar25 = uVar18 + 3;
              if ((uVar14 == 0) && (local_80[0] - 1 == uVar18)) {
                uVar25 = 3;
              }
              goto LAB_01d5f8e7;
            }
            iVar26 = 3;
          }
          uVar25 = iVar26 - (uint)(uVar14 == 0);
        }
LAB_01d5f8e7:
        if (uVar25 < 4) {
          uVar13 = uVar25 - (uVar14 != 0);
          if (uVar13 != 0) {
            if (uVar13 == 3) {
              uVar18 = local_80[0] - 1;
            }
            else {
              uVar18 = local_80[uVar13];
            }
            puVar15 = local_80 + 1;
            if (uVar13 == 1) {
              puVar15 = local_80 + 2;
            }
            local_80[2] = *puVar15;
            local_80[1] = local_80[0];
            local_80[0] = uVar18;
          }
        }
        else {
          local_80[1] = local_80[0];
          local_80[2] = uVar13;
          local_80[0] = uVar25 - 3;
        }
      }
      if ((cctx->appliedParams).validateSequences == 0) {
LAB_01d5f9d0:
        if ((cctx->seqStore).maxNbSeq <= (ulong)(uVar22 - seqPos->idx)) {
          pZVar17 = (ZSTD_CCtx *)0xffffffffffffff95;
          goto LAB_01d5fa3c;
        }
        local_60 = (ulong)uVar5;
        local_38 = pZVar23;
        if (local_40 < (BYTE *)((long)src + uVar14)) {
          local_48 = (BYTE *)src;
          ZSTD_safecopyLiterals
                    ((cctx->seqStore).lit,(BYTE *)src,(BYTE *)((long)src + uVar14),local_40);
          seqPos = local_70;
          cctx = local_58;
          src = local_48;
        }
        else {
          pBVar10 = (cctx->seqStore).lit;
          uVar9 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar10 = *src;
          *(undefined8 *)(pBVar10 + 8) = uVar9;
          if (0x10 < uVar6) {
            pBVar10 = (cctx->seqStore).lit;
            uVar9 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar10 + 0x18) = uVar9;
            if (0x20 < uVar6) {
              lVar21 = 0;
              do {
                uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar21 + 0x20) + 8);
                pBVar2 = pBVar10 + lVar21 + 0x20;
                *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar21 + 0x20);
                *(undefined8 *)(pBVar2 + 8) = uVar9;
                uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar21 + 0x30) + 8);
                *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar21 + 0x30);
                *(undefined8 *)(pBVar2 + 0x18) = uVar9;
                lVar21 = lVar21 + 0x20;
              } while (pBVar2 + 0x20 < pBVar10 + uVar14);
            }
          }
        }
        ppBVar3 = &(cctx->seqStore).lit;
        *ppBVar3 = *ppBVar3 + uVar14;
        if (0xffff < uVar6) {
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar11 = (cctx->seqStore).sequences;
        psVar11->litLength = (U16)uVar6;
        psVar11->offBase = uVar25;
        if (0xffff < local_60 - 3) {
          (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar11->mlBase = (U16)(local_60 - 3);
        (cctx->seqStore).sequences = psVar11 + 1;
        src = (void *)((long)src + (ulong)((int)local_60 + uVar6));
        bVar12 = true;
        pZVar17 = local_38;
      }
      else {
        uVar16 = (ulong)(uVar5 + uVar6) + seqPos->posInSrc;
        seqPos->posInSrc = uVar16;
        uVar20 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
        uVar19 = local_68 + uVar16;
        if (uVar20 < uVar16) {
          uVar19 = uVar20;
        }
        pZVar17 = (ZSTD_CCtx *)0xffffffffffffff95;
        if (((ulong)uVar25 <= uVar19 + 3) &&
           (pZVar17 = (ZSTD_CCtx *)0x0,
           uVar5 < 4 - ((cctx->appliedParams).cParams.minMatch == 3 ||
                       (cctx->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0))) {
          pZVar17 = (ZSTD_CCtx *)0xffffffffffffff95;
        }
        if (pZVar17 < (ZSTD_CCtx *)0xffffffffffffff89) goto LAB_01d5f9d0;
LAB_01d5fa3c:
        bVar12 = false;
      }
      if (!bVar12) {
        return (size_t)pZVar17;
      }
      uVar22 = uVar22 + 1;
      uVar14 = (ulong)uVar22;
      pZVar23 = pZVar17;
    } while (uVar14 < inSeqsSize);
  }
  uVar5 = local_80[1];
  if (uVar22 == uVar4 || externalRepSearch != ZSTD_ps_disable) goto LAB_01d5fbf0;
  if (uVar22 - 1 < uVar4 + 2) {
    if (uVar22 == uVar4 + 2) goto LAB_01d5fbb5;
    local_80[1] = local_80[0];
    local_80[2] = uVar5;
  }
  else {
    local_80[0] = inSeqs[uVar22 - 3].offset;
LAB_01d5fbb5:
    local_80[1] = inSeqs[uVar22 - 2].offset;
    local_80[2] = local_80[0];
  }
  local_80[0] = inSeqs[uVar22 - 1].offset;
LAB_01d5fbf0:
  pZVar8 = (cctx->blockState).nextCBlock;
  pZVar8->rep[2] = local_80[2];
  *(ulong *)pZVar8->rep = CONCAT44(local_80[1],local_80[0]);
  uVar19 = (ulong)inSeqs[uVar14].litLength;
  if (uVar19 != 0) {
    switchD_015ff80e::default((cctx->seqStore).lit,src,uVar19);
    ppBVar3 = &(cctx->seqStore).lit;
    *ppBVar3 = *ppBVar3 + uVar19;
    src = (void *)((long)src + (ulong)inSeqs[uVar14].litLength);
    local_70->posInSrc = local_70->posInSrc + (ulong)inSeqs[uVar14].litLength;
    seqPos = local_70;
  }
  sVar24 = 0xffffffffffffff95;
  if ((BYTE *)src == local_50) {
    seqPos->idx = uVar22 + 1;
    sVar24 = 0;
  }
  return sVar24;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, ZSTD_hasExtSeqProd(&cctx->appliedParams)),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}